

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_view_data.hpp
# Opt level: O3

void duckdb::ArrowListViewData<int>::AppendListMetadata
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to,
               vector<unsigned_int,_true> *child_sel)

{
  vector<duckdb::ArrowBuffer,_true> *this;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  long lVar7;
  iterator __position;
  uint uVar8;
  reference pvVar9;
  reference pvVar10;
  long lVar11;
  InvalidInputException *this_00;
  idx_t iVar12;
  int params_1;
  ulong uVar13;
  long lVar14;
  string local_50;
  
  this = &append_data->arrow_buffers;
  pvVar9 = vector<duckdb::ArrowBuffer,_true>::operator[](this,1);
  pvVar10 = vector<duckdb::ArrowBuffer,_true>::operator[](this,1);
  lVar14 = (to - from) * 4;
  iVar12 = pvVar10->count + lVar14;
  ArrowBuffer::reserve(pvVar9,iVar12);
  pvVar9->count = iVar12;
  pvVar9 = vector<duckdb::ArrowBuffer,_true>::operator[](this,2);
  pvVar10 = vector<duckdb::ArrowBuffer,_true>::operator[](this,2);
  iVar12 = lVar14 + pvVar10->count;
  ArrowBuffer::reserve(pvVar9,iVar12);
  pvVar9->count = iVar12;
  pdVar2 = format->data;
  pvVar9 = vector<duckdb::ArrowBuffer,_true>::operator[](this,1);
  pdVar3 = pvVar9->dataptr;
  pvVar9 = vector<duckdb::ArrowBuffer,_true>::operator[](this,2);
  pdVar4 = pvVar9->dataptr;
  iVar12 = append_data->row_count;
  if (iVar12 == 0) {
    params_1 = 0;
  }
  else {
    params_1 = *(int *)(pdVar4 + iVar12 * 4 + -4) + *(int *)(pdVar3 + iVar12 * 4 + -4);
  }
  if (to != from) {
    lVar14 = 0;
    do {
      uVar13 = lVar14 + from;
      psVar5 = format->sel->sel_vector;
      if (psVar5 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar5[uVar13];
      }
      lVar11 = append_data->row_count + lVar14;
      puVar6 = (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)) {
        lVar7 = *(long *)(pdVar2 + uVar13 * 0x10 + 8);
        if ((params_1 + lVar7 & 0xffffffff80000000U) != 0) {
          this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Arrow Appender: The maximum combined list offset for regular list buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list buffers"
                     ,"");
          InvalidInputException::InvalidInputException<int,int>
                    (this_00,&local_50,0x7fffffff,params_1);
          __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        *(int *)(pdVar3 + lVar11 * 4) = params_1;
        *(int *)(pdVar4 + lVar11 * 4) = (int)lVar7;
        params_1 = (int)(params_1 + lVar7);
        if (lVar7 != 0) {
          lVar11 = 0;
          do {
            uVar8 = (int)*(undefined8 *)(pdVar2 + uVar13 * 0x10) + (int)lVar11;
            local_50._M_dataplus._M_p._0_4_ = uVar8;
            __position._M_current =
                 (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                         __position,(uint *)&local_50);
            }
            else {
              *__position._M_current = uVar8;
              (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar7 != lVar11);
        }
      }
      else {
        *(int *)(pdVar3 + lVar11 * 4) = params_1;
        pdVar1 = pdVar4 + lVar11 * 4;
        pdVar1[0] = '\0';
        pdVar1[1] = '\0';
        pdVar1[2] = '\0';
        pdVar1[3] = '\0';
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != to - from);
  }
  return;
}

Assistant:

static void AppendListMetadata(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to,
	                               vector<sel_t> &child_sel) {
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		idx_t size = to - from;
		append_data.GetMainBuffer().resize(append_data.GetMainBuffer().size() + sizeof(BUFTYPE) * size);
		append_data.GetAuxBuffer().resize(append_data.GetAuxBuffer().size() + sizeof(BUFTYPE) * size);
		auto data = UnifiedVectorFormat::GetData<list_entry_t>(format);
		auto offset_data = append_data.GetMainBuffer().GetData<BUFTYPE>();
		auto size_data = append_data.GetAuxBuffer().GetData<BUFTYPE>();

		BUFTYPE last_offset =
		    append_data.row_count ? offset_data[append_data.row_count - 1] + size_data[append_data.row_count - 1] : 0;
		for (idx_t i = 0; i < size; i++) {
			auto source_idx = format.sel->get_index(i + from);
			auto offset_idx = append_data.row_count + i;

			if (!format.validity.RowIsValid(source_idx)) {
				offset_data[offset_idx] = last_offset;
				size_data[offset_idx] = 0;
				continue;
			}

			// append the offset data
			auto list_length = data[source_idx].length;
			if (std::is_same<BUFTYPE, int32_t>::value == true &&
			    (uint64_t)last_offset + list_length > NumericLimits<int32_t>::Maximum()) {
				throw InvalidInputException(
				    "Arrow Appender: The maximum combined list offset for regular list buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), last_offset);
			}
			offset_data[offset_idx] = last_offset;
			size_data[offset_idx] = UnsafeNumericCast<BUFTYPE>(list_length);
			last_offset += list_length;

			for (idx_t k = 0; k < list_length; k++) {
				child_sel.push_back(UnsafeNumericCast<sel_t>(data[source_idx].offset + k));
			}
		}
	}